

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O2

int __thiscall
ktx::OptionsEncodeBasis<false>::init(OptionsEncodeBasis<false> *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *pOVar2;
  allocator<char> local_5b1;
  allocator<char> local_5b0;
  allocator<char> local_5af;
  allocator<char> local_5ae;
  allocator<char> local_5ad;
  allocator<char> local_5ac;
  allocator<char> local_5ab;
  allocator<char> local_5aa;
  allocator<char> local_5a9;
  allocator<char> local_5a8;
  allocator<char> local_5a7;
  allocator<char> local_5a6;
  allocator<char> local_5a5;
  allocator<char> local_5a4;
  allocator<char> local_5a3;
  allocator<char> local_5a2;
  allocator<char> local_5a1;
  allocator<char> local_5a0;
  allocator<char> local_59f;
  allocator<char> local_59e;
  allocator<char> local_59d;
  allocator<char> local_59c;
  allocator<char> local_59b;
  allocator<char> local_59a;
  allocator<char> local_599;
  element_type *local_598;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_590;
  element_type *local_588;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_580;
  shared_ptr<const_cxxopts::Value> local_578;
  element_type *local_568;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_560;
  shared_ptr<const_cxxopts::Value> local_558;
  element_type *local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_540;
  shared_ptr<const_cxxopts::Value> local_538;
  element_type *local_528;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_520;
  shared_ptr<const_cxxopts::Value> local_518;
  element_type *local_508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_500;
  shared_ptr<const_cxxopts::Value> local_4f8;
  shared_ptr<const_cxxopts::Value> local_4e8;
  element_type *local_4d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4d0;
  shared_ptr<const_cxxopts::Value> local_4c8;
  element_type *local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4b0;
  shared_ptr<const_cxxopts::Value> local_4a8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [40];
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Encode BasisLZ",&local_599);
  cxxopts::Options::add_options((OptionAdder *)local_298,(Options *)ctx,&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,kCLevel,&local_59a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,
             "BasisLZ compression level, an encoding speed vs. quality level tradeoff. Range is [0,6], default is 1. Higher values are slower but give higher quality."
             ,&local_59b);
  cxxopts::value<unsigned_int>();
  local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_508;
  local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_500._M_pi;
  local_508 = (element_type *)0x0;
  _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"<level>",&local_59c);
  pOVar2 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_298,&local_2b8,&local_2d8,&local_4f8,&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,kQLevel,&local_59d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,
             "BasisLZ quality level. Range is [1,255]. Lower gives better compression/lower quality/faster. Higher gives less compression/higher quality/slower. --qlevel automatically determines values for --max-endpoints, --max-selectors, --endpoint-rdo-threshold and --selector-rdo-threshold for the target quality level. Setting these options overrides the values determined by --qlevel which defaults to 128 if neither it nor --max-endpoints and --max-selectors have been set."
             ,&local_59e);
  cxxopts::value<unsigned_int>();
  local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_528;
  local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_520._M_pi;
  local_528 = (element_type *)0x0;
  _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"<level>",&local_59f);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_2f8,&local_318,&local_518,&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,kMaxEndpoints,&local_5a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,
             "Manually set the maximum number of color endpoint clusters. Range is [1,16128]. Default is 0, unset."
             ,&local_5a1);
  cxxopts::value<unsigned_int>();
  local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_548;
  local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_540._M_pi;
  local_548 = (element_type *)0x0;
  _Stack_540._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"<arg>",&local_5a2);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_338,&local_358,&local_538,&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,kEndpointRdoThreshold,&local_5a3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,
             "Set endpoint RDO quality threshold. The default is 1.25. Lower is higher quality but less quality per output bit (try [1.0,3.0]). This will override the value chosen by --qlevel."
             ,&local_5a4);
  cxxopts::value<float>();
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_568;
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_560._M_pi;
  local_568 = (element_type *)0x0;
  _Stack_560._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"<arg>",&local_5a5);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_378,&local_398,&local_558,&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,kMaxSelectors,&local_5a6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "Manually set the maximum number of color selector clusters from [1,16128]. Default is 0, unset."
             ,&local_5a7);
  cxxopts::value<unsigned_int>();
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_588;
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_580._M_pi;
  local_588 = (element_type *)0x0;
  _Stack_580._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"<arg>",&local_5a8);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_3b8,&local_3d8,&local_578,&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,kSelectorRdoThreshold,&local_5a9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,
             "Set selector RDO quality threshold. The default is 1.25. Lower is higher quality but less quality per output bit (try [1.0,3.0]). This will override the value chosen by --qlevel."
             ,&local_5aa);
  cxxopts::value<float>();
  local_4e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_598;
  local_4e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_590._M_pi;
  local_598 = (element_type *)0x0;
  _Stack_590._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"<arg>",&local_5ab);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_3f8,&local_418,&local_4e8,&local_110);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,kNoEndpointRdo,&local_5ac)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,
             "Disable endpoint rate distortion optimizations. Slightly faster, less noisy output, but lower quality per output bit. Default is to do endpoint RDO."
             ,&local_5ad);
  cxxopts::value<bool>();
  local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4b8;
  local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4b0._M_pi;
  local_4b8 = (element_type *)0x0;
  _Stack_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"",&local_5ae);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_438,&local_458,&local_4a8,&local_130);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,kNoSelectorRdo,&local_5af)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,
             "Disable selector rate distortion optimizations. Slightly faster, less noisy output, but lower quality per output bit. Default is to do selector RDO."
             ,&local_5b0);
  cxxopts::value<bool>();
  local_4c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4d8;
  local_4c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4d0._M_pi;
  local_4d8 = (element_type *)0x0;
  _Stack_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_5b1);
  cxxopts::OptionAdder::operator()(pOVar2,&local_478,&local_498,&local_4c8,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4d0);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_590);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_580);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_560);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_540);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_520);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_500);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)(local_298 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Encode UASTC",&local_599)
  ;
  cxxopts::Options::add_options((OptionAdder *)local_298,(Options *)ctx,&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,kUastcQuality,&local_59a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,
             "UASTC compression level, an encoding speed vs. quality level tradeoff. Range is [0,4], default is 1. Higher values are slower but give higher quality."
             ,&local_59b);
  cxxopts::value<unsigned_int>();
  local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_508;
  local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_500._M_pi;
  local_508 = (element_type *)0x0;
  _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"<level>",&local_59c);
  pOVar2 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_298,&local_2b8,&local_2d8,&local_4f8,&local_190);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,kUastcRdo,&local_59d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"Enable UASTC RDO post-processing.",&local_59e);
  cxxopts::value<bool>();
  local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_528;
  local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_520._M_pi;
  local_528 = (element_type *)0x0;
  _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_59f);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_2f8,&local_318,&local_518,&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,kUastcRdoL,&local_5a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,
             "Set UASTC RDO quality scalar to the specified value. Lower values yield higher quality/larger supercompressed files, higher values yield lower quality/smaller supercompressed files. A good range to try is [.25,10]. For normal maps a good range is [.25,.75]. The full range is [.001,10.0]. Default is 1.0."
             ,&local_5a1);
  cxxopts::value<float>();
  local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_548;
  local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_540._M_pi;
  local_548 = (element_type *)0x0;
  _Stack_540._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"<lambda>",&local_5a2);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_338,&local_358,&local_538,&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,kUastcRdoD,&local_5a3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,
             "Set UASTC RDO dictionary size in bytes. Default is 4096. Lower values=faster, but give less compression. Range is [64,65536]."
             ,&local_5a4);
  cxxopts::value<unsigned_int>();
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_568;
  local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_560._M_pi;
  local_568 = (element_type *)0x0;
  _Stack_560._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"<dictsize>",&local_5a5);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_378,&local_398,&local_558,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,kUastcRdoB,&local_5a6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "Set UASTC RDO max smooth block error scale. Range is [1.0,300.0]. Default is 10.0, 1.0 is disabled. Larger values suppress more artifacts (and allocate more bits) on smooth blocks."
             ,&local_5a7);
  cxxopts::value<float>();
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_588;
  local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_580._M_pi;
  local_588 = (element_type *)0x0;
  _Stack_580._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"<scale>",&local_5a8);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_3b8,&local_3d8,&local_578,&local_210);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,kUastcRdoS,&local_5a9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,
             "Set UASTC RDO max smooth block standard deviation. Range is [.01,65536.0]. Default is 18.0. Larger values expand the range of blocks considered smooth."
             ,&local_5aa);
  cxxopts::value<float>();
  local_4e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_598;
  local_4e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_590._M_pi;
  local_598 = (element_type *)0x0;
  _Stack_590._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"<deviation>",&local_5ab);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_3f8,&local_418,&local_4e8,&local_230);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,kUastcRdoF,&local_5ac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"Do not favor simpler UASTC modes in RDO mode.",&local_5ad);
  cxxopts::value<bool>();
  local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4b8;
  local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4b0._M_pi;
  local_4b8 = (element_type *)0x0;
  _Stack_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_5ae);
  pOVar2 = cxxopts::OptionAdder::operator()(pOVar2,&local_438,&local_458,&local_4a8,&local_250);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,kUastcRdoM,&local_5af);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,
             "Disable RDO multithreading (slightly higher compression, deterministic).",&local_5b0);
  cxxopts::value<bool>();
  local_4c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_4d8;
  local_4c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_4d0._M_pi;
  local_4d8 = (element_type *)0x0;
  _Stack_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"",&local_5b1);
  cxxopts::OptionAdder::operator()(pOVar2,&local_478,&local_498,&local_4c8,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4c8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4d0);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_250);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_230);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_590);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_210);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_578.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_580);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_558.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_560);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_538.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_540);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_518.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_520);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_500);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)(local_298 + 8));
  iVar1 = std::__cxx11::string::~string((string *)&local_170);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options("Encode BasisLZ")
            (kCLevel, "BasisLZ compression level, an encoding speed vs. quality level tradeoff. "
                "Range is [0,6], default is 1. Higher values are slower but give higher quality.",
                cxxopts::value<uint32_t>(), "<level>")
            (kQLevel, "BasisLZ quality level. Range is [1,255]. Lower gives better compression/lower "
                "quality/faster. Higher gives less compression/higher quality/slower. --qlevel "
                "automatically determines values for --max-endpoints, --max-selectors, "
                "--endpoint-rdo-threshold and --selector-rdo-threshold for the target quality level. "
                "Setting these options overrides the values determined by --qlevel which defaults to "
                "128 if neither it nor --max-endpoints and --max-selectors have been set.",
                cxxopts::value<uint32_t>(), "<level>")
            (kMaxEndpoints, "Manually set the maximum number of color endpoint clusters. Range "
                "is [1,16128]. Default is 0, unset.",
                cxxopts::value<uint32_t>(), "<arg>")
            (kEndpointRdoThreshold, "Set endpoint RDO quality threshold. The default is 1.25. Lower "
                "is higher quality but less quality per output bit (try [1.0,3.0]). This will override "
                "the value chosen by --qlevel.", cxxopts::value<float>(), "<arg>")
            (kMaxSelectors, "Manually set the maximum number of color selector clusters from [1,16128]. "
                "Default is 0, unset.", cxxopts::value<uint32_t>(), "<arg>")
            (kSelectorRdoThreshold, "Set selector RDO quality threshold. The default is 1.25. Lower "
                "is higher quality but less quality per output bit (try [1.0,3.0]). This will override "
                "the value chosen by --qlevel.", cxxopts::value<float>(), "<arg>")
            (kNoEndpointRdo, "Disable endpoint rate distortion optimizations. Slightly faster, "
                "less noisy output, but lower quality per output bit. Default is to do endpoint RDO.")
            (kNoSelectorRdo, "Disable selector rate distortion optimizations. Slightly faster, "
                "less noisy output, but lower quality per output bit. Default is to do selector RDO.");
        opts.add_options("Encode UASTC")
            (kUastcQuality, "UASTC compression level, an encoding speed vs. quality level tradeoff. "
                "Range is [0,4], default is 1. Higher values are slower but give higher quality.",
                cxxopts::value<uint32_t>(), "<level>")
            (kUastcRdo, "Enable UASTC RDO post-processing.")
            (kUastcRdoL, "Set UASTC RDO quality scalar to the specified value. Lower values yield "
                "higher quality/larger supercompressed files, higher values yield lower quality/smaller "
                "supercompressed files. A good range to try is [.25,10]. For normal maps a good range is "
                "[.25,.75]. The full range is [.001,10.0]. Default is 1.0.",
                cxxopts::value<float>(), "<lambda>")
            (kUastcRdoD, "Set UASTC RDO dictionary size in bytes. Default is 4096. Lower values=faster, "
                "but give less compression. Range is [64,65536].",
                cxxopts::value<uint32_t>(), "<dictsize>")
            (kUastcRdoB, "Set UASTC RDO max smooth block error scale. Range is [1.0,300.0]. Default "
                "is 10.0, 1.0 is disabled. Larger values suppress more artifacts (and allocate more bits) "
                "on smooth blocks.", cxxopts::value<float>(), "<scale>")
            (kUastcRdoS, "Set UASTC RDO max smooth block standard deviation. Range is [.01,65536.0]. "
                "Default is 18.0. Larger values expand the range of blocks considered smooth.",
                cxxopts::value<float>(), "<deviation>")
            (kUastcRdoF, "Do not favor simpler UASTC modes in RDO mode.")
            (kUastcRdoM, "Disable RDO multithreading (slightly higher compression, deterministic).");
    }